

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall mjs::interpreter::impl::hoist(impl *this,scan_result *sr)

{
  gc_heap *h;
  function_definition *func;
  bool bVar1;
  __tuple_element_t<0UL,_tuple<vector<basic_string<wchar_t>,_allocator<basic_string<wchar_t>_>_>,_vector<const_function_definition_*,_allocator<const_function_definition_*>_>_>_>
  *this_00;
  __tuple_element_t<1UL,_tuple<vector<basic_string<wchar_t>,_allocator<basic_string<wchar_t>_>_>,_vector<const_function_definition_*,_allocator<const_function_definition_*>_>_>_>
  *this_01;
  reference ppfVar2;
  scope *psVar3;
  wstring_view wVar4;
  function_definition *f;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  type *__range2_1;
  wstring_view local_70;
  string local_60;
  wstring *local_50;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *var_id;
  const_iterator __end2;
  const_iterator __begin2;
  type *__range2;
  type *funcs;
  type *ids;
  scan_result *sr_local;
  impl *this_local;
  
  this_00 = std::
            get<0ul,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::vector<mjs::function_definition_const*,std::allocator<mjs::function_definition_const*>>>
                      (sr);
  this_01 = std::
            get<1ul,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::vector<mjs::function_definition_const*,std::allocator<mjs::function_definition_const*>>>
                      (sr);
  __end2 = std::
           vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           ::begin(this_00);
  var_id = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
           std::
           vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                                *)&var_id);
    if (!bVar1) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
               ::operator*(&__end2);
    psVar3 = gc_heap_ptr<mjs::interpreter::impl::scope>::operator->(&this->active_scope_);
    bVar1 = scope::has_property(psVar3,local_50);
    if (!bVar1) {
      psVar3 = gc_heap_ptr<mjs::interpreter::impl::scope>::operator->(&this->active_scope_);
      h = this->heap_;
      wVar4 = (wstring_view)
              std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)local_50);
      local_70 = wVar4;
      string::string(&local_60,h,&local_70);
      scope::put_local(psVar3,&local_60,(value *)value::undefined);
      string::~string(&local_60);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_*,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
    ::operator++(&__end2);
  }
  __end2_1 = std::
             vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>
             ::begin(this_01);
  f = (function_definition *)
      std::
      vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>::
      end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<const_mjs::function_definition_*const_*,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
                        *)&f);
    if (!bVar1) break;
    ppfVar2 = __gnu_cxx::
              __normal_iterator<const_mjs::function_definition_*const_*,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
              ::operator*(&__end2_1);
    func = *ppfVar2;
    psVar3 = gc_heap_ptr<mjs::interpreter::impl::scope>::operator->(&this->active_scope_);
    scope::put_local_function(psVar3,this,func);
    __gnu_cxx::
    __normal_iterator<const_mjs::function_definition_*const_*,_std::vector<const_mjs::function_definition_*,_std::allocator<const_mjs::function_definition_*>_>_>
    ::operator++(&__end2_1);
  }
  return;
}

Assistant:

void hoist(const hoisting_visitor::scan_result& sr) {
        const auto& [ids, funcs] = sr;
        for (const auto& var_id: ids) {
            if (!active_scope_->has_property(var_id)) {
                active_scope_->put_local(string{heap_, var_id}, value::undefined);
            }
        }
        for (const auto f: funcs) {
            active_scope_->put_local_function(*this, *f);
        }
    }